

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O0

REF_STATUS ref_agents_migrate(REF_AGENTS ref_agents)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT ref_malloc_init_i_3;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *recv_dbl;
  REF_DBL *send_dbl;
  REF_GLOB *recv_glob;
  REF_GLOB *send_glob;
  REF_INT *recv_int;
  REF_INT *send_int;
  REF_INT *destination;
  int local_40;
  REF_INT n_dbls;
  REF_INT n_globs;
  REF_INT n_ints;
  REF_INT rec;
  REF_INT dest;
  REF_INT nrecv;
  REF_INT nsend;
  REF_INT id;
  REF_INT i;
  REF_MPI ref_mpi;
  REF_AGENTS ref_agents_local;
  
  _id = ref_agents->ref_mpi;
  dest = 0;
  ref_mpi = (REF_MPI)ref_agents;
  for (nrecv = 0; nrecv < ref_mpi->id; nrecv = nrecv + 1) {
    if (*(int *)((long)ref_mpi->comm + (long)nrecv * 0x68) != 0) {
      uVar1 = ref_agents_dest((REF_AGENTS)ref_mpi,nrecv,&n_ints);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
               0x115,"ref_agents_migrate",(ulong)uVar1,"dest");
        return uVar1;
      }
      if (_id->id != n_ints) {
        dest = dest + 1;
      }
    }
  }
  n_dbls = 6;
  local_40 = 1;
  destination._4_4_ = 7;
  if (dest < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x11d,
           "ref_agents_migrate","malloc destination of REF_INT negative");
    ref_agents_local._4_4_ = 1;
  }
  else {
    send_int = (REF_INT *)malloc((long)dest << 2);
    if (send_int == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
             0x11d,"ref_agents_migrate","malloc destination of REF_INT NULL");
      ref_agents_local._4_4_ = 2;
    }
    else {
      for (ref_malloc_init_i_2 = 0; ref_malloc_init_i_2 < dest;
          ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
        send_int[ref_malloc_init_i_2] = -1;
      }
      if (dest * n_dbls < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
               0x11e,"ref_agents_migrate","malloc send_int of REF_INT negative");
        ref_agents_local._4_4_ = 1;
      }
      else {
        recv_int = (REF_INT *)malloc((long)(dest * n_dbls) << 2);
        if (recv_int == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
                 0x11e,"ref_agents_migrate","malloc send_int of REF_INT NULL");
          ref_agents_local._4_4_ = 2;
        }
        else {
          for (ref_malloc_init_i_3 = 0; ref_malloc_init_i_3 < dest * n_dbls;
              ref_malloc_init_i_3 = ref_malloc_init_i_3 + 1) {
            recv_int[ref_malloc_init_i_3] = -1;
          }
          if (dest * local_40 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                   ,0x11f,"ref_agents_migrate","malloc send_glob of REF_GLOB negative");
            ref_agents_local._4_4_ = 1;
          }
          else {
            recv_glob = (REF_GLOB *)malloc((long)(dest * local_40) << 3);
            if (recv_glob == (REF_GLOB *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                     ,0x11f,"ref_agents_migrate","malloc send_glob of REF_GLOB NULL");
              ref_agents_local._4_4_ = 2;
            }
            else {
              for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < dest * local_40;
                  ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                recv_glob[ref_private_macro_code_rss_1] = -1;
              }
              if (dest * destination._4_4_ < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                       ,0x120,"ref_agents_migrate","malloc send_dbl of REF_DBL negative");
                ref_agents_local._4_4_ = 1;
              }
              else {
                recv_dbl = (REF_DBL *)malloc((long)(dest * destination._4_4_) << 3);
                if (recv_dbl == (REF_DBL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                         ,0x120,"ref_agents_migrate","malloc send_dbl of REF_DBL NULL");
                  ref_agents_local._4_4_ = 2;
                }
                else {
                  for (ref_private_macro_code_rss_2 = 0;
                      ref_private_macro_code_rss_2 < dest * destination._4_4_;
                      ref_private_macro_code_rss_2 = ref_private_macro_code_rss_2 + 1) {
                    recv_dbl[ref_private_macro_code_rss_2] = 0.0;
                  }
                  dest = 0;
                  for (nrecv = 0; nrecv < ref_mpi->id; nrecv = nrecv + 1) {
                    if (*(int *)((long)ref_mpi->comm + (long)nrecv * 0x68) != 0) {
                      uVar1 = ref_agents_dest((REF_AGENTS)ref_mpi,nrecv,&n_ints);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                               ,0x123,"ref_agents_migrate",(ulong)uVar1,"dest");
                        return uVar1;
                      }
                      if (_id->id != n_ints) {
                        send_int[dest] = n_ints;
                        recv_int[dest * n_dbls] =
                             *(REF_INT *)((long)ref_mpi->comm + (long)nrecv * 0x68);
                        recv_int[dest * n_dbls + 1] =
                             *(REF_INT *)((long)ref_mpi->comm + (long)nrecv * 0x68 + 0xc);
                        recv_int[dest * n_dbls + 2] =
                             *(REF_INT *)((long)ref_mpi->comm + (long)nrecv * 0x68 + 0x10);
                        recv_int[dest * n_dbls + 3] =
                             *(REF_INT *)((long)ref_mpi->comm + (long)nrecv * 0x68 + 0x14);
                        recv_int[dest * n_dbls + 4] =
                             *(REF_INT *)((long)ref_mpi->comm + (long)nrecv * 0x68 + 0x18);
                        recv_int[dest * n_dbls + 5] =
                             *(REF_INT *)((long)ref_mpi->comm + (long)nrecv * 0x68 + 0x28);
                        recv_glob[dest * local_40] =
                             *(REF_GLOB *)((long)ref_mpi->comm + (long)nrecv * 0x68 + 0x20);
                        for (nsend = 0; nsend < 3; nsend = nsend + 1) {
                          recv_dbl[nsend + dest * destination._4_4_] =
                               *(REF_DBL *)
                                ((long)ref_mpi->comm + (long)nsend * 8 + (long)nrecv * 0x68 + 0x30);
                        }
                        for (nsend = 0; nsend < 4; nsend = nsend + 1) {
                          recv_dbl[nsend + 3 + dest * destination._4_4_] =
                               *(REF_DBL *)
                                ((long)ref_mpi->comm + (long)nsend * 8 + (long)nrecv * 0x68 + 0x48);
                        }
                        uVar1 = ref_agents_remove((REF_AGENTS)ref_mpi,nrecv);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                                 ,0x134,"ref_agents_migrate",(ulong)uVar1,"poof");
                          return uVar1;
                        }
                        dest = dest + 1;
                      }
                    }
                  }
                  uVar1 = ref_mpi_blindsend(_id,send_int,recv_int,n_dbls,dest,&send_glob,&rec,1);
                  if (uVar1 == 0) {
                    uVar1 = ref_mpi_blindsend(_id,send_int,recv_glob,local_40,dest,&send_dbl,&rec,2)
                    ;
                    if (uVar1 == 0) {
                      uVar1 = ref_mpi_blindsend(_id,send_int,recv_dbl,destination._4_4_,dest,
                                                (void **)&ref_malloc_init_i,&rec,3);
                      if (uVar1 == 0) {
                        if (recv_dbl != (REF_DBL *)0x0) {
                          free(recv_dbl);
                        }
                        if (recv_glob != (REF_GLOB *)0x0) {
                          free(recv_glob);
                        }
                        if (recv_int != (REF_INT *)0x0) {
                          free(recv_int);
                        }
                        if (send_int != (REF_INT *)0x0) {
                          free(send_int);
                        }
                        for (n_globs = 0; n_globs < rec; n_globs = n_globs + 1) {
                          uVar1 = ref_agents_new((REF_AGENTS)ref_mpi,&nrecv);
                          if (uVar1 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                                   ,0x149,"ref_agents_migrate",(ulong)uVar1,"new");
                            return uVar1;
                          }
                          *(undefined4 *)((long)ref_mpi->comm + (long)nrecv * 0x68) =
                               *(undefined4 *)((long)send_glob + (long)(n_globs * n_dbls) * 4);
                          *(undefined4 *)((long)ref_mpi->comm + (long)nrecv * 0x68 + 0xc) =
                               *(undefined4 *)((long)send_glob + (long)(n_globs * n_dbls + 1) * 4);
                          *(undefined4 *)((long)ref_mpi->comm + (long)nrecv * 0x68 + 0x10) =
                               *(undefined4 *)((long)send_glob + (long)(n_globs * n_dbls + 2) * 4);
                          *(undefined4 *)((long)ref_mpi->comm + (long)nrecv * 0x68 + 0x14) =
                               *(undefined4 *)((long)send_glob + (long)(n_globs * n_dbls + 3) * 4);
                          *(undefined4 *)((long)ref_mpi->comm + (long)nrecv * 0x68 + 0x18) =
                               *(undefined4 *)((long)send_glob + (long)(n_globs * n_dbls + 4) * 4);
                          *(undefined4 *)((long)ref_mpi->comm + (long)nrecv * 0x68 + 0x28) =
                               *(undefined4 *)((long)send_glob + (long)(n_globs * n_dbls + 5) * 4);
                          *(REF_DBL *)((long)ref_mpi->comm + (long)nrecv * 0x68 + 0x20) =
                               send_dbl[n_globs * local_40];
                          for (nsend = 0; nsend < 3; nsend = nsend + 1) {
                            *(undefined8 *)
                             ((long)ref_mpi->comm + (long)nsend * 8 + (long)nrecv * 0x68 + 0x30) =
                                 *(undefined8 *)
                                  ((long)_ref_malloc_init_i +
                                  (long)(nsend + n_globs * destination._4_4_) * 8);
                          }
                          for (nsend = 0; nsend < 4; nsend = nsend + 1) {
                            *(undefined8 *)
                             ((long)ref_mpi->comm + (long)nsend * 8 + (long)nrecv * 0x68 + 0x48) =
                                 *(undefined8 *)
                                  ((long)_ref_malloc_init_i +
                                  (long)(nsend + 3 + n_globs * destination._4_4_) * 8);
                          }
                        }
                        if (_ref_malloc_init_i != (void *)0x0) {
                          free(_ref_malloc_init_i);
                        }
                        if (send_dbl != (REF_DBL *)0x0) {
                          free(send_dbl);
                        }
                        if (send_glob != (REF_GLOB *)0x0) {
                          free(send_glob);
                        }
                        ref_agents_local._4_4_ = 0;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                               ,0x142,"ref_agents_migrate",(ulong)uVar1,"ds");
                        ref_agents_local._4_4_ = uVar1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                             ,0x13f,"ref_agents_migrate",(ulong)uVar1,"is");
                      ref_agents_local._4_4_ = uVar1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                           ,0x13c,"ref_agents_migrate",(ulong)uVar1,"is");
                    ref_agents_local._4_4_ = uVar1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return ref_agents_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_agents_migrate(REF_AGENTS ref_agents) {
  REF_MPI ref_mpi = ref_agents->ref_mpi;
  REF_INT i, id, nsend, nrecv, dest, rec;
  REF_INT n_ints, n_globs, n_dbls;
  REF_INT *destination, *send_int, *recv_int;
  REF_GLOB *send_glob, *recv_glob;
  REF_DBL *send_dbl, *recv_dbl;
  nsend = 0;
  each_active_ref_agent(ref_agents, id) {
    RSS(ref_agents_dest(ref_agents, id, &dest), "dest");
    if (ref_mpi_rank(ref_mpi) != dest) {
      nsend++;
    }
  }
  n_ints = 6;
  n_globs = 1;
  n_dbls = 7;
  ref_malloc_init(destination, nsend, REF_INT, REF_EMPTY);
  ref_malloc_init(send_int, nsend * n_ints, REF_INT, REF_EMPTY);
  ref_malloc_init(send_glob, nsend * n_globs, REF_GLOB, REF_EMPTY);
  ref_malloc_init(send_dbl, nsend * n_dbls, REF_DBL, 0.0);
  nsend = 0;
  each_active_ref_agent(ref_agents, id) {
    RSS(ref_agents_dest(ref_agents, id, &dest), "dest");
    if (ref_mpi_rank(ref_mpi) != dest) {
      destination[nsend] = dest;
      send_int[0 + nsend * n_ints] = (REF_INT)ref_agent_mode(ref_agents, id);
      send_int[1 + nsend * n_ints] = ref_agent_home(ref_agents, id);
      send_int[2 + nsend * n_ints] = ref_agent_node(ref_agents, id);
      send_int[3 + nsend * n_ints] = ref_agent_part(ref_agents, id);
      send_int[4 + nsend * n_ints] = ref_agent_seed(ref_agents, id);
      send_int[5 + nsend * n_ints] = ref_agent_step(ref_agents, id);

      send_glob[0 + nsend * n_globs] = ref_agent_global(ref_agents, id);

      for (i = 0; i < 3; i++)
        send_dbl[i + nsend * n_dbls] = ref_agent_xyz(ref_agents, i, id);
      for (i = 0; i < 4; i++)
        send_dbl[3 + i + nsend * n_dbls] = ref_agent_bary(ref_agents, i, id);

      RSS(ref_agents_remove(ref_agents, id), "poof");

      nsend++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, destination, (void *)send_int, n_ints, nsend,
                        (void **)(&recv_int), &nrecv, REF_INT_TYPE),
      "is");
  RSS(ref_mpi_blindsend(ref_mpi, destination, (void *)send_glob, n_globs, nsend,
                        (void **)(&recv_glob), &nrecv, REF_GLOB_TYPE),
      "is");
  RSS(ref_mpi_blindsend(ref_mpi, destination, (void *)send_dbl, n_dbls, nsend,
                        (void **)(&recv_dbl), &nrecv, REF_DBL_TYPE),
      "ds");
  ref_free(send_dbl);
  ref_free(send_glob);
  ref_free(send_int);
  ref_free(destination);

  for (rec = 0; rec < nrecv; rec++) {
    RSS(ref_agents_new(ref_agents, &id), "new");
    ref_agent_mode(ref_agents, id) = (REF_AGENT_MODE)recv_int[0 + rec * n_ints];
    ref_agent_home(ref_agents, id) = recv_int[1 + rec * n_ints];
    ref_agent_node(ref_agents, id) = recv_int[2 + rec * n_ints];
    ref_agent_part(ref_agents, id) = recv_int[3 + rec * n_ints];
    ref_agent_seed(ref_agents, id) = recv_int[4 + rec * n_ints];
    ref_agent_step(ref_agents, id) = recv_int[5 + rec * n_ints];

    ref_agent_global(ref_agents, id) = recv_glob[0 + rec * n_globs];

    for (i = 0; i < 3; i++)
      ref_agent_xyz(ref_agents, i, id) = recv_dbl[i + rec * n_dbls];
    for (i = 0; i < 4; i++)
      ref_agent_bary(ref_agents, i, id) = recv_dbl[3 + i + rec * n_dbls];
  }

  ref_free(recv_dbl);
  ref_free(recv_glob);
  ref_free(recv_int);

  return REF_SUCCESS;
}